

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O1

sexp sexp_copy_list_op(sexp ctx,sexp self,sexp_sint_t n,sexp ls)

{
  sexp psVar1;
  sexp_sint_t n_00;
  sexp psVar2;
  sexp psVar3;
  sexp_sint_t extraout_RDX;
  sexp_sint_t extraout_RDX_00;
  sexp res;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp local_40;
  sexp_gc_var_t local_38;
  
  local_40 = (sexp)0x43e;
  if ((((ulong)ls & 3) == 0) && (ls->tag == 6)) {
    local_38.var = &local_40;
    local_38.next = (ctx->value).context.saves;
    (ctx->value).context.saves = &local_38;
    psVar2 = sexp_cons_op(ctx,self,n,(ls->value).type.name,(ls->value).type.cpl);
    psVar1 = (ls->value).type.cpl;
    ls = psVar2;
    n_00 = extraout_RDX;
    for (; (((ulong)psVar1 & 3) == 0 && (psVar1->tag == 6)); psVar1 = (psVar1->value).type.cpl) {
      local_40 = ls;
      psVar3 = sexp_cons_op(ctx,self,n_00,(psVar1->value).type.name,(psVar1->value).type.cpl);
      (psVar2->value).type.cpl = psVar3;
      psVar2 = psVar3;
      ls = local_40;
      n_00 = extraout_RDX_00;
    }
    (ctx->value).context.saves = local_38.next;
  }
  return ls;
}

Assistant:

sexp sexp_copy_list_op (sexp ctx, sexp self, sexp_sint_t n, sexp ls) {
  sexp tmp;
  sexp_gc_var1(res);
  if (! sexp_pairp(ls)) return ls;
  sexp_gc_preserve1(ctx, res);
  tmp = res = sexp_cons(ctx, sexp_car(ls), sexp_cdr(ls));
  for (ls=sexp_cdr(ls); sexp_pairp(ls); ls=sexp_cdr(ls), tmp=sexp_cdr(tmp))
    sexp_cdr(tmp) = sexp_cons(ctx, sexp_car(ls), sexp_cdr(ls));
  sexp_gc_release1(ctx);
  return res;
}